

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::Json_BorderAgentEncodingDecoding_Test::TestBody
          (Json_BorderAgentEncodingDecoding_Test *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char *expected_predicate_value;
  string local_480;
  string local_460;
  string local_440;
  allocator local_420;
  allocator local_41f;
  allocator local_41e;
  allocator local_41d;
  allocator local_41c;
  allocator local_41b;
  allocator local_41a;
  allocator local_419;
  AssertionResult gtest_ar_;
  State local_3f4;
  json json;
  UnixTime local_3e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3b8;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  BorderAgent new_val;
  BorderAgent ba_orig;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&json,(nullptr_t)0x0);
  BorderAgent::BorderAgent(&new_val);
  std::__cxx11::string::string((string *)&local_480,"1.1.1.1",&local_419);
  local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&gtest_ar_,anon_var_dwarf_4657bc + 9,&local_41a);
  BorderAgent::State::State(&local_3f4,4,2,1,0,0);
  std::__cxx11::string::string((string *)&local_440,"net1",&local_41b);
  std::__cxx11::string::string((string *)&local_460,anon_var_dwarf_4657bc + 9,&local_41c);
  std::__cxx11::string::string((string *)&local_340,anon_var_dwarf_4657bc + 9,&local_41d);
  std::__cxx11::string::string((string *)&local_360,anon_var_dwarf_4657bc + 9,&local_41e);
  local_3d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_380,anon_var_dwarf_4657bc + 9,&local_41f);
  std::__cxx11::string::string((string *)&local_3a0,anon_var_dwarf_4657bc + 9,&local_420);
  UnixTime::UnixTime(&local_3e0,0);
  expected_predicate_value = (char *)(ulong)(uint)local_3f4;
  BorderAgent::BorderAgent
            (&ba_orig,&local_480,1,(ByteArray *)&local_3b8,(string *)&gtest_ar_,local_3f4,&local_440
             ,0x101010101010101,&local_460,&local_340,(Timestamp)0x0,0,&local_360,
             (ByteArray *)&local_3d8,&local_380,'\0',0,&local_3a0,local_3e0,0x3b);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d8);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
  std::__cxx11::string::~string((string *)&local_480);
  BorderAgentToJson(&ba_orig,&json);
  BorderAgentFromJson(&new_val,&json);
  gtest_ar_.success_ = (bool)((byte)new_val.mPresentFlags & 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kAddrBit) != 0","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x7d,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)((byte)new_val.mPresentFlags >> 1 & 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kPortBit) != 0","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x7e,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)((byte)new_val.mPresentFlags >> 4 & 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kNetworkNameBit) != 0",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x7f,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)((byte)new_val.mPresentFlags >> 5 & 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x80,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)((byte)new_val.mPresentFlags >> 3 & 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kStateBit) != 0","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x81,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = std::operator==(&new_val.mAddr,&ba_orig.mAddr);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,(AssertionResult *)"new_val.mAddr == ba_orig.mAddr"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x82,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = new_val.mPort == ba_orig.mPort;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,(AssertionResult *)"new_val.mPort == ba_orig.mPort"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x83,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = std::operator==(&new_val.mNetworkName,&ba_orig.mNetworkName);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"new_val.mNetworkName == ba_orig.mNetworkName","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x84,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  uVar1 = BorderAgent::State::operator_cast_to_unsigned_int(&new_val.mState);
  uVar2 = BorderAgent::State::operator_cast_to_unsigned_int(&ba_orig.mState);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = uVar1 == uVar2;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"new_val.mState == ba_orig.mState","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x85,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = new_val.mExtendedPanId == ba_orig.mExtendedPanId;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_480,(internal *)&gtest_ar_,
               (AssertionResult *)"new_val.mExtendedPanId == ba_orig.mExtendedPanId","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x86,local_480._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  BorderAgent::~BorderAgent(&ba_orig);
  BorderAgent::~BorderAgent(&new_val);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return;
}

Assistant:

TEST(Json, BorderAgentEncodingDecoding)
{
    nlohmann::json json;
    BorderAgent    new_val;
    BorderAgent    ba_orig{"1.1.1.1",
                        1,
                        ByteArray{},
                        "",
                        BorderAgent::State{BorderAgent::State::ConnectionMode::kX509Connection,
                                           BorderAgent::State::ThreadInterfaceStatus::kActive,
                                           BorderAgent::State::Availability::kHigh, 0, 0},
                        "net1",
                        0x0101010101010101,
                        "",
                        "",
                        Timestamp{},
                        0,
                        "",
                        ByteArray{},
                        "",
                        0,
                        0,
                        "",
                        0,
                        BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                            BorderAgent::kExtendedPanIdBit | BorderAgent::kStateBit};

    BorderAgentToJson(ba_orig, json);

    BorderAgentFromJson(new_val, json);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kAddrBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kPortBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kNetworkNameBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kStateBit) != 0);
    EXPECT_TRUE(new_val.mAddr == ba_orig.mAddr);
    EXPECT_TRUE(new_val.mPort == ba_orig.mPort);
    EXPECT_TRUE(new_val.mNetworkName == ba_orig.mNetworkName);
    EXPECT_TRUE(new_val.mState == ba_orig.mState);
    EXPECT_TRUE(new_val.mExtendedPanId == ba_orig.mExtendedPanId);
}